

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void ImGui::SetScrollHereY(float center_y_ratio)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImGuiWindow *pIVar4;
  float fVar5;
  
  pIVar4 = GImGui->CurrentWindow;
  fVar1 = (pIVar4->DC).CursorPosPrevLine.y;
  fVar2 = (pIVar4->Pos).y;
  fVar5 = (center_y_ratio + -0.5) * (GImGui->Style).ItemSpacing.y;
  fVar3 = (pIVar4->DC).PrevLineSize.y;
  pIVar4->WriteAccessed = true;
  (pIVar4->ScrollTarget).y =
       (float)(int)(fVar3 * center_y_ratio + fVar5 + fVar5 + (fVar1 - fVar2) + (pIVar4->Scroll).y);
  (pIVar4->ScrollTargetCenterRatio).y = center_y_ratio;
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->WriteAccessed = true; return g.CurrentWindow; }